

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.cpp
# Opt level: O2

sample_t * Timidity::resample_voice(Renderer *song,Voice *vp,int *countptr)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  ushort uVar4;
  Sample *pSVar5;
  sample_t *psVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  sample_t *psVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  sample_t *psVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  
  pSVar5 = vp->sample;
  if (pSVar5->sample_rate == 0) {
    iVar12 = vp->sample_offset >> 0xc;
    iVar7 = (pSVar5->data_length >> 0xc) - iVar12;
    if (*countptr < iVar7) {
      vp->sample_offset = *countptr * 0x1000 + vp->sample_offset;
    }
    else {
      vp->status = '\0';
      *countptr = iVar7;
    }
    psVar17 = pSVar5->data + iVar12;
  }
  else {
    uVar4 = pSVar5->modes;
    bVar10 = vp->status;
    if (((bVar10 & 0x10) != 0) && (pSVar5->loop_end - pSVar5->loop_start < 2)) {
      bVar10 = bVar10 & 0xef;
      vp->status = bVar10;
    }
    if (vp->vibrato_control_ratio == 0) {
      if ((bVar10 & 0x10) == 0) {
        psVar17 = song->resample_buffer;
        psVar6 = pSVar5->data;
        uVar16 = vp->sample_offset;
        iVar12 = vp->sample_increment;
        uVar9 = pSVar5->data_length;
        iVar7 = *countptr;
        iVar14 = -iVar12;
        if (0 < iVar12) {
          iVar14 = iVar12;
        }
        iVar12 = (int)(uVar9 - uVar16) / iVar14;
        iVar18 = iVar12 + 1;
        if (iVar7 <= iVar12) {
          iVar18 = iVar7;
        }
        for (lVar11 = 0; iVar18 != (int)lVar11; lVar11 = lVar11 + 1) {
          psVar17[lVar11] =
               (float)(uVar16 & 0xfff) * 0.00024414062 *
               (psVar6[(long)((int)uVar16 >> 0xc) + 1] - psVar6[(int)uVar16 >> 0xc]) +
               psVar6[(int)uVar16 >> 0xc];
          uVar16 = uVar16 + iVar14;
        }
        iVar14 = -1;
        if (iVar12 < iVar7) {
          iVar14 = iVar12 - iVar7;
        }
        if ((int)uVar9 <= (int)uVar16) {
          if (uVar16 == uVar9) {
            psVar17[lVar11] = psVar6[(int)uVar9 >> 0xc];
          }
          vp->status = '\0';
          *countptr = iVar14 + iVar7;
        }
        vp->sample_offset = uVar16;
      }
      else {
        psVar17 = song->resample_buffer;
        iVar12 = *countptr;
        uVar16 = vp->sample_offset;
        iVar7 = vp->sample_increment;
        iVar14 = pSVar5->loop_start;
        iVar18 = pSVar5->loop_end;
        if ((uVar4 & 8) != 0) {
          psVar6 = pSVar5->data;
          psVar13 = psVar17;
          if ((int)uVar16 <= iVar14) {
            iVar8 = (int)(iVar14 - uVar16) / iVar7;
            iVar15 = iVar12;
            if (iVar8 < iVar12) {
              iVar15 = iVar8 + 1;
            }
            while (iVar15 != 0) {
              *psVar13 = (float)(uVar16 & 0xfff) * 0.00024414062 *
                         (psVar6[(long)((int)uVar16 >> 0xc) + 1] - psVar6[(int)uVar16 >> 0xc]) +
                         psVar6[(int)uVar16 >> 0xc];
              uVar16 = uVar16 + iVar7;
              psVar13 = psVar13 + 1;
              iVar15 = iVar15 + -1;
            }
            iVar15 = iVar12 - (iVar8 + 1);
            bVar20 = iVar8 < iVar12;
            iVar12 = 0;
            if (bVar20) {
              iVar12 = iVar15;
            }
          }
          do {
            iVar8 = iVar14;
            if (0 < iVar7) {
              iVar8 = iVar18;
            }
            do {
              if (iVar12 == 0) {
                vp->sample_increment = iVar7;
                goto LAB_00371b3b;
              }
              iVar15 = (int)(iVar8 - uVar16) / iVar7;
              iVar19 = iVar12;
              if (iVar15 < iVar12) {
                iVar19 = iVar15 + 1;
              }
              while (bVar20 = iVar19 != 0, iVar19 = iVar19 + -1, bVar20) {
                *psVar13 = (float)(uVar16 & 0xfff) * 0.00024414062 *
                           (psVar6[(long)((int)uVar16 >> 0xc) + 1] - psVar6[(int)uVar16 >> 0xc]) +
                           psVar6[(int)uVar16 >> 0xc];
                psVar13 = psVar13 + 1;
                uVar16 = uVar16 + iVar7;
              }
              bVar20 = iVar12 <= iVar15;
              iVar12 = iVar12 - (iVar15 + 1);
              if (bVar20) {
                iVar12 = 0;
              }
              iVar15 = iVar18;
            } while (((int)uVar16 < iVar18) && (iVar15 = iVar14, iVar14 < (int)uVar16));
            uVar16 = iVar15 * 2 - uVar16;
            iVar7 = -iVar7;
          } while( true );
        }
        psVar6 = pSVar5->data;
        psVar13 = psVar17;
        while (iVar12 != 0) {
          iVar8 = iVar14 - iVar18;
          if ((int)uVar16 < iVar18) {
            iVar8 = 0;
          }
          uVar16 = uVar16 + iVar8;
          iVar8 = (int)(iVar18 - uVar16) / iVar7;
          iVar15 = iVar12;
          if (iVar8 < iVar12) {
            iVar15 = iVar8 + 1;
          }
          while (bVar20 = iVar15 != 0, iVar15 = iVar15 + -1, bVar20) {
            fVar2 = psVar6[(int)uVar16 >> 0xc];
            *psVar13 = (float)(uVar16 & 0xfff) * 0.00024414062 *
                       (psVar6[(long)((int)uVar16 >> 0xc) + 1] - fVar2) + fVar2;
            psVar13 = psVar13 + 1;
            uVar16 = uVar16 + iVar7;
          }
          bVar20 = iVar12 <= iVar8;
          iVar12 = iVar12 - (iVar8 + 1);
          if (bVar20) {
            iVar12 = 0;
          }
        }
LAB_00371b3b:
        vp->sample_offset = uVar16;
      }
    }
    else if ((bVar10 & 0x10) == 0) {
      psVar17 = song->resample_buffer;
      fVar2 = song->rate;
      psVar6 = pSVar5->data;
      uVar16 = pSVar5->data_length;
      iVar12 = vp->sample_increment;
      iVar7 = -iVar12;
      if (0 < iVar12) {
        iVar7 = iVar12;
      }
      iVar12 = vp->vibrato_control_counter;
      iVar14 = *countptr + 1;
      psVar13 = psVar17;
      uVar9 = vp->sample_offset;
      do {
        if (iVar14 == 1) goto LAB_00371828;
        bVar20 = iVar12 == 0;
        iVar12 = iVar12 + -1;
        if (bVar20) {
          iVar12 = vp->vibrato_control_ratio;
          iVar7 = update_vibrato(fVar2,vp,0);
        }
        uVar1 = iVar7 + uVar9;
        *psVar13 = (float)(uVar9 & 0xfff) * 0.00024414062 *
                   (psVar6[(long)((int)uVar9 >> 0xc) + 1] - psVar6[(int)uVar9 >> 0xc]) +
                   psVar6[(int)uVar9 >> 0xc];
        psVar13 = psVar13 + 1;
        iVar14 = iVar14 + -1;
        uVar9 = uVar1;
      } while ((int)uVar1 < (int)uVar16);
      if (uVar1 == uVar16) {
        *psVar13 = psVar6[(int)uVar16 >> 0xc];
      }
      vp->status = '\0';
      *countptr = *countptr - iVar14;
LAB_00371828:
      vp->vibrato_control_counter = iVar12;
      vp->sample_increment = iVar7;
      vp->sample_offset = uVar9;
    }
    else {
      psVar17 = song->resample_buffer;
      fVar2 = song->rate;
      iVar12 = *countptr;
      uVar16 = vp->sample_offset;
      uVar9 = vp->sample_increment;
      iVar7 = pSVar5->loop_start;
      iVar14 = pSVar5->loop_end;
      if ((uVar4 & 8) == 0) {
        psVar6 = pSVar5->data;
        psVar13 = psVar17;
        iVar18 = vp->vibrato_control_counter;
        while (iVar12 != 0) {
          iVar8 = iVar7 - iVar14;
          if ((int)uVar16 < iVar14) {
            iVar8 = 0;
          }
          uVar16 = uVar16 + iVar8;
          iVar8 = (int)(iVar14 - uVar16) / (int)uVar9;
          iVar15 = iVar8 + 1;
          if (iVar12 <= iVar8) {
            iVar15 = iVar12;
          }
          iVar8 = iVar18;
          iVar19 = iVar18;
          if (iVar15 < iVar18) {
            iVar8 = iVar15;
            iVar19 = iVar15;
          }
          while (iVar8 != 0) {
            fVar3 = psVar6[(int)uVar16 >> 0xc];
            *psVar13 = (float)(uVar16 & 0xfff) * 0.00024414062 *
                       (psVar6[(long)((int)uVar16 >> 0xc) + 1] - fVar3) + fVar3;
            psVar13 = psVar13 + 1;
            uVar16 = uVar16 + uVar9;
            iVar8 = iVar8 + -1;
          }
          iVar12 = iVar12 - iVar19;
          bVar20 = iVar18 < iVar15;
          iVar18 = iVar18 - iVar15;
          if (bVar20) {
            iVar18 = vp->vibrato_control_ratio;
            uVar9 = update_vibrato(fVar2,vp,0);
          }
        }
        vp->vibrato_control_counter = iVar18;
      }
      else {
        psVar6 = pSVar5->data;
        psVar13 = psVar17;
        iVar18 = vp->vibrato_control_counter;
        while ((iVar12 != 0 && ((int)uVar16 <= iVar7))) {
          iVar8 = (int)(iVar7 - uVar16) / (int)uVar9;
          iVar15 = iVar8 + 1;
          if (iVar12 <= iVar8) {
            iVar15 = iVar12;
          }
          iVar8 = iVar18;
          iVar19 = iVar18;
          if (iVar15 < iVar18) {
            iVar8 = iVar15;
            iVar19 = iVar15;
          }
          while (iVar8 != 0) {
            *psVar13 = (float)(uVar16 & 0xfff) * 0.00024414062 *
                       (psVar6[(long)((int)uVar16 >> 0xc) + 1] - psVar6[(int)uVar16 >> 0xc]) +
                       psVar6[(int)uVar16 >> 0xc];
            psVar13 = psVar13 + 1;
            uVar16 = uVar16 + uVar9;
            iVar8 = iVar8 + -1;
          }
          iVar12 = iVar12 - iVar19;
          bVar20 = iVar18 < iVar15;
          iVar18 = iVar18 - iVar15;
          if (bVar20) {
            iVar18 = vp->vibrato_control_ratio;
            uVar9 = update_vibrato(fVar2,vp,0);
          }
        }
        while (iVar12 != 0) {
          iVar8 = iVar7;
          if (0 < (int)uVar9) {
            iVar8 = iVar14;
          }
          iVar8 = (int)(iVar8 - uVar16) / (int)uVar9;
          iVar15 = iVar8 + 1;
          if (iVar12 <= iVar8) {
            iVar15 = iVar12;
          }
          iVar19 = iVar18;
          iVar8 = iVar18;
          if (iVar15 < iVar18) {
            iVar19 = iVar15;
            iVar8 = iVar15;
          }
          while (iVar19 != 0) {
            *psVar13 = (float)(uVar16 & 0xfff) * 0.00024414062 *
                       (psVar6[(long)((int)uVar16 >> 0xc) + 1] - psVar6[(int)uVar16 >> 0xc]) +
                       psVar6[(int)uVar16 >> 0xc];
            psVar13 = psVar13 + 1;
            uVar16 = uVar16 + uVar9;
            iVar19 = iVar19 + -1;
          }
          bVar20 = iVar18 < iVar15;
          iVar18 = iVar18 - iVar15;
          if (bVar20) {
            iVar18 = vp->vibrato_control_ratio;
            uVar9 = update_vibrato(fVar2,vp,uVar9 >> 0x1f);
          }
          iVar12 = iVar12 - iVar8;
          iVar8 = iVar14;
          if ((iVar14 <= (int)uVar16) || (iVar8 = iVar7, (int)uVar16 <= iVar7)) {
            uVar16 = iVar8 * 2 - uVar16;
            uVar9 = -uVar9;
          }
        }
        vp->vibrato_control_counter = iVar18;
      }
      vp->sample_increment = uVar9;
      vp->sample_offset = uVar16;
    }
  }
  return psVar17;
}

Assistant:

sample_t *resample_voice(Renderer *song, Voice *vp, int *countptr)
{
	int ofs;
	WORD modes;

	if (vp->sample->sample_rate == 0)
	{
		/* Pre-resampled data -- just update the offset and check if
		we're out of data. */
		ofs = vp->sample_offset >> FRACTION_BITS; /* Kind of silly to use FRACTION_BITS here... */
		if (*countptr >= (vp->sample->data_length >> FRACTION_BITS) - ofs)
		{
			/* Note finished. Free the voice. */
			vp->status = 0;

			/* Let the caller know how much data we had left */
			*countptr = (vp->sample->data_length >> FRACTION_BITS) - ofs;
		}
		else
		{
			vp->sample_offset += *countptr << FRACTION_BITS;
		}
		return vp->sample->data + ofs;
	}

	/* Need to resample. Use the proper function. */
	modes = vp->sample->modes;

	if (vp->status & VOICE_LPE)
	{
		if (vp->sample->loop_end - vp->sample->loop_start < 2)
		{ // Loop is too short; turn it off.
			vp->status &= ~VOICE_LPE;
		}
	}

	if (vp->vibrato_control_ratio)
	{
		if (vp->status & VOICE_LPE)
		{
			if (modes & PATCH_BIDIR)
				return rs_vib_bidir(song->resample_buffer, song->rate, vp, *countptr);
			else
				return rs_vib_loop(song->resample_buffer, song->rate, vp, *countptr);
		}
		else
		{
			return rs_vib_plain(song->resample_buffer, song->rate, vp, countptr);
		}
	}
	else
	{
		if (vp->status & VOICE_LPE)
		{
			if (modes & PATCH_BIDIR)
				return rs_bidir(song->resample_buffer, vp, *countptr);
			else
				return rs_loop(song->resample_buffer, vp, *countptr);
		}
		else
		{
			return rs_plain(song->resample_buffer, vp, countptr);
		}
	}
}